

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O2

void CreateBackwardReferencesNH65
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals,BackwardReferenceFromDecoder *backward_references,
               size_t *back_refs_position,size_t back_refs_size)

{
  int *piVar1;
  undefined1 *puVar2;
  DictWord *pDVar3;
  ulong uVar4;
  long lVar5;
  DictWord *pDVar6;
  DictWord *pDVar7;
  byte bVar8;
  ushort uVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  uint64_t uVar13;
  uint16_t *puVar14;
  long lVar15;
  long lVar16;
  uint16_t *puVar17;
  size_t sVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  DictWord *pDVar23;
  undefined8 uVar24;
  void *pvVar25;
  ulong uVar26;
  ulong uVar27;
  ulong *puVar28;
  ulong uVar29;
  byte bVar30;
  uint uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  long lVar35;
  char *pcVar36;
  short sVar37;
  uint uVar38;
  uint uVar39;
  size_t sVar40;
  DictWord *pDVar41;
  size_t *psVar42;
  ulong uVar43;
  size_t *psVar44;
  DictWord *pDVar45;
  undefined1 *puVar46;
  int iVar47;
  uint uVar48;
  DictWord *pDVar49;
  long lVar50;
  DictWord *pDVar51;
  DictWord *pDVar52;
  int last_distance;
  ulong uVar53;
  ulong uVar54;
  long lVar55;
  ulong uVar56;
  ulong uVar57;
  long lVar58;
  uint8_t *puVar59;
  DictWord *pDVar60;
  DictWord *pDVar61;
  ulong uVar62;
  ulong uVar63;
  ulong uVar64;
  bool bVar65;
  bool bVar66;
  bool bVar67;
  undefined1 auVar68 [16];
  undefined1 *puStack_190;
  ulong local_188;
  DictWord *local_168;
  ulong local_160;
  size_t cur_ix_masked;
  ulong local_138;
  DictWord *local_120;
  ulong local_110;
  ulong local_108;
  ulong local_e0;
  int local_d0;
  DictWord *local_c8;
  size_t *local_c0;
  int local_50;
  
  bVar30 = literal_context_lut[8];
  pDVar6 = (DictWord *)((position - 7) + num_bytes);
  pDVar49 = (DictWord *)position;
  if (7 < num_bytes) {
    pDVar49 = pDVar6;
  }
  lVar50 = 0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    lVar50 = 0x40;
  }
  lVar12 = *(long *)(literal_context_lut + 0x10);
  local_110 = *(ulong *)dist_cache;
  uVar31 = *(uint *)&(params->dictionary).words;
  if (4 < (int)uVar31) {
    iVar47 = *(int *)&(hasher->common).extra;
    *(int *)&(hasher->common).dict_num_matches = iVar47 + -1;
    *(int *)((long)&(hasher->common).dict_num_matches + 4) = iVar47 + 1;
    (hasher->common).params.type = iVar47 + -2;
    (hasher->common).params.bucket_bits = iVar47 + 2;
    (hasher->common).params.block_bits = iVar47 + -3;
    (hasher->common).params.hash_len = iVar47 + 3;
    if (10 < uVar31) {
      iVar47 = *(int *)((long)&(hasher->common).extra + 4);
      (hasher->common).params.num_last_distances_to_check = iVar47 + -1;
      (hasher->common).is_prepared_ = iVar47 + 1;
      *(int *)&hasher->privat = iVar47 + -2;
      *(int *)((long)&hasher->privat + 4) = iVar47 + 2;
      (hasher->privat)._H5.block_size_ = CONCAT44(iVar47 + 3,iVar47 + -3);
    }
  }
  pDVar7 = (DictWord *)((1L << (bVar30 & 0x3f)) - 0x10);
  pDVar3 = (DictWord *)(position + num_bytes);
  puVar59 = (uint8_t *)(lVar50 + position);
  lVar5 = position - 1;
  local_c0 = last_insert_len;
  auVar68 = _DAT_001360d0;
LAB_0010eb0b:
LAB_0010eb1b:
  pDVar61 = (DictWord *)position;
  if (pDVar3 <= pDVar61 + 2) {
    *(undefined1 **)dist_cache = (undefined1 *)((long)pDVar3 + (local_110 - (long)pDVar61));
    *(long *)commands = *(long *)commands + ((long)local_c0 - (long)last_insert_len >> 4);
    return;
  }
  local_108 = (long)pDVar3 - (long)pDVar61;
  pDVar45 = pDVar7;
  if (pDVar61 < pDVar7) {
    pDVar45 = pDVar61;
  }
  local_c8 = (DictWord *)(&pDVar61->len + lVar12);
  if (pDVar7 <= (DictWord *)(&pDVar61->len + lVar12)) {
    local_c8 = pDVar7;
  }
  pDVar41 = *(DictWord **)(literal_context_lut + 0x50);
  uVar13 = (params->dictionary).cutoffTransforms;
  puVar14 = (params->dictionary).hash_table_words;
  uVar22 = (ulong)pDVar61 & ringbuffer_mask;
  psVar44 = *(size_t **)backward_references;
  psVar42 = num_literals + (long)psVar44 * 2;
  do {
    uVar31 = (uint)local_108;
    uVar39 = (uint)ringbuffer_mask;
    bVar65 = back_refs_position == (size_t *)0x0;
    if (back_refs_position <= psVar44) {
LAB_0010ec0d:
      puVar28 = (ulong *)(ringbuffer + uVar22);
      uVar53 = 0x7e4;
      pDVar23 = (DictWord *)0x0;
      local_160 = 0;
      uVar26 = 0;
      uVar62 = 0;
      do {
        if (uVar26 == (long)*(int *)&(params->dictionary).words) {
          uVar26 = *puVar28;
          uVar32._0_4_ = (params->dist).alphabet_size_max;
          uVar32._4_4_ = (params->dist).alphabet_size_limit;
          uVar32 = (uVar32 & uVar26) * 0x1fe35a7bd3579bd3 >>
                   ((byte)(params->dist).distance_postfix_bits & 0x3f);
          uVar29 = uVar32 & 0xffffffff;
          uVar38 = (int)uVar32 << (*(byte *)((long)&(params->dist).max_distance + 4) & 0x1f);
          uVar9 = *(ushort *)(uVar13 + uVar29 * 2);
          uVar27 = (ulong)uVar9;
          piVar1 = &(params->hasher).num_last_distances_to_check;
          uVar32 = 0;
          if (*(ulong *)piVar1 <= uVar27) {
            uVar32 = uVar27 - *(long *)piVar1;
          }
          uVar48 = (uint)(params->dist).max_distance;
          do {
            local_168 = pDVar23;
            uVar34 = uVar62;
            uVar33 = uVar53;
            local_188 = local_160;
            uVar43 = uVar34 + uVar22;
            do {
              do {
                do {
                  do {
                    if (uVar27 <= uVar32) {
LAB_0010efc9:
                      *(int *)(puVar14 + (ulong)uVar38 * 2 + (ulong)(uVar48 & uVar9) * 2) =
                           (int)pDVar61;
                      *(ushort *)(uVar13 + uVar29 * 2) = uVar9 + 1;
                      if (uVar33 != 0x7e4) {
                        bVar66 = true;
                        iVar47 = 0;
                        goto LAB_0010f58e;
                      }
                      if (!bVar65) {
                        bVar66 = true;
                        if (back_refs_position <= psVar44) {
                          uVar33 = 0x7e4;
                          bVar65 = false;
                          iVar47 = 0;
                          goto LAB_0010f58e;
                        }
                        pDVar23 = (DictWord *)(long)(int)*psVar42;
                        goto LAB_0010f0c3;
                      }
                      lVar55 = *(long *)&(params->dictionary).num_transforms;
                      uVar53 = *(ulong *)(lVar55 + 8);
                      local_138 = *(ulong *)(lVar55 + 0x10);
                      bVar65 = true;
                      if (uVar53 >> 7 <= local_138) {
                        local_d0 = (int)uVar26;
                        uVar62 = (ulong)((uint)(local_d0 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
                        lVar15 = *(long *)(literal_context_lut + 0x78);
                        uVar33 = 0x7e4;
                        iVar47 = 0;
                        lVar58 = 0;
                        goto LAB_0010f2b7;
                      }
                      bVar66 = true;
                      goto LAB_0010f589;
                    }
                    uVar27 = uVar27 - 1;
                    uVar19 = *(uint *)(puVar14 +
                                      (ulong)uVar38 * 2 + (ulong)((uint)uVar27 & uVar48) * 2);
                    pDVar23 = (DictWord *)((long)pDVar61 - (ulong)uVar19);
                    if (pDVar45 < pDVar23) goto LAB_0010efc9;
                  } while (ringbuffer_mask < uVar43);
                  uVar62 = (ulong)(uVar19 & uVar39);
                  uVar53 = uVar62 + uVar34;
                } while ((ringbuffer_mask < uVar53) || (ringbuffer[uVar43] != ringbuffer[uVar53]));
                uVar53 = 0;
                lVar55 = 0;
LAB_0010eeda:
                uVar63 = local_108 & 0xfffffffffffffff8;
                uVar64 = (ulong)(uVar31 & 7);
                if (local_108 >> 3 == uVar53) {
                  for (; (local_160 = local_108, uVar64 != 0 &&
                         (local_160 = uVar63,
                         ringbuffer[uVar63 + uVar62] == *(uint8_t *)((long)puVar28 + uVar63)));
                      uVar63 = uVar63 + 1) {
                    uVar64 = uVar64 - 1;
                  }
                }
                else {
                  if (puVar28[uVar53] == *(ulong *)(ringbuffer + uVar53 * 8 + uVar62))
                  goto code_r0x0010eef6;
                  uVar62 = *(ulong *)(ringbuffer + uVar53 * 8 + uVar62) ^ puVar28[uVar53];
                  uVar53 = 0;
                  if (uVar62 != 0) {
                    for (; (uVar62 >> uVar53 & 1) == 0; uVar53 = uVar53 + 1) {
                    }
                  }
                  local_160 = (uVar53 >> 3 & 0x1fffffff) - lVar55;
                }
                if ((psVar44 < back_refs_position) &&
                   ((undefined1 *)(long)(int)*psVar42 < &pDVar61->len + local_160)) {
                  local_160 = (long)(int)*psVar42 - (long)pDVar61;
                }
              } while (local_160 < 4);
              iVar47 = 0x1f;
              if ((uint)pDVar23 != 0) {
                for (; (uint)pDVar23 >> iVar47 == 0; iVar47 = iVar47 + -1) {
                }
              }
              uVar53 = (ulong)(iVar47 * -0x1e + 0x780) + local_160 * 0x87;
              uVar62 = local_160;
            } while (uVar53 <= uVar33);
          } while( true );
        }
        pDVar51 = (DictWord *)(long)*(int *)((long)&(hasher->common).extra + uVar26 * 4);
        if (((pDVar51 <= pDVar45) && ((DictWord *)((long)pDVar61 - (long)pDVar51) < pDVar61)) &&
           (uVar62 + uVar22 <= ringbuffer_mask)) {
          uVar32 = (ulong)((long)pDVar61 - (long)pDVar51) & ringbuffer_mask;
          if ((uVar32 + uVar62 <= ringbuffer_mask) &&
             (ringbuffer[uVar62 + uVar22] == ringbuffer[uVar32 + uVar62])) {
            uVar27 = 0;
            lVar55 = 0;
LAB_0010ecdb:
            uVar29 = (ulong)(uVar31 & 7);
            uVar43 = local_108 & 0xfffffffffffffff8;
            if (local_108 >> 3 == uVar27) {
              for (; (uVar27 = local_108, uVar29 != 0 &&
                     (uVar27 = uVar43,
                     ringbuffer[uVar43 + uVar32] == *(uint8_t *)((long)puVar28 + uVar43)));
                  uVar43 = uVar43 + 1) {
                uVar29 = uVar29 - 1;
              }
            }
            else {
              if (puVar28[uVar27] == *(ulong *)(ringbuffer + uVar27 * 8 + uVar32))
              goto code_r0x0010ecf7;
              uVar27 = *(ulong *)(ringbuffer + uVar27 * 8 + uVar32) ^ puVar28[uVar27];
              uVar32 = 0;
              if (uVar27 != 0) {
                for (; (uVar27 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                }
              }
              uVar27 = (uVar32 >> 3 & 0x1fffffff) - lVar55;
            }
            if ((psVar44 < back_refs_position) &&
               ((undefined1 *)(long)(int)*psVar42 < &pDVar61->len + uVar27)) {
              uVar27 = (long)(int)*psVar42 - (long)pDVar61;
            }
            if (((2 < uVar27) || ((uVar26 < 2 && (uVar27 == 2)))) &&
               (uVar32 = uVar27 * 0x87 + 0x78f, uVar53 < uVar32)) {
              if (uVar26 != 0) {
                uVar32 = uVar32 - ((0x1ca10U >> ((byte)uVar26 & 0xe) & 0xe) + 0x27);
              }
              if (uVar53 < uVar32) {
                uVar53 = uVar32;
                uVar62 = uVar27;
                pDVar23 = pDVar51;
                local_160 = uVar27;
              }
            }
          }
        }
        uVar26 = uVar26 + 1;
      } while( true );
    }
    pDVar23 = (DictWord *)(long)(int)*psVar42;
    if (pDVar61 <= pDVar23) {
      if (pDVar61 == pDVar23) {
        uVar38 = (uint)psVar42[1];
        local_168 = (DictWord *)(long)(int)uVar38;
        if ((pDVar61 <= (DictWord *)((long)pDVar61 - (long)local_168)) ||
           (*(uint *)((long)psVar42 + 0xc) < uVar38)) {
          local_188 = 0;
          local_168 = (DictWord *)0x0;
LAB_0010f0c3:
          bVar66 = true;
          if (pDVar61 == pDVar23) {
            uVar38 = (uint)psVar42[1];
            if ((int)uVar38 <= *(int *)((long)psVar42 + 0xc)) goto LAB_0010f580;
            uVar48 = *(uint *)((long)psVar42 + 4);
            uVar53 = (ulong)uVar48;
            if (0x14 < uVar48 - 4 || 0x7ffffffc < (int)uVar38) {
              bVar66 = false;
              goto LAB_0010f580;
            }
            uVar19 = ~(uint)pDVar45 + uVar38;
            lVar55 = *(long *)(literal_context_lut + 0x58);
            iVar47 = (int)uVar19 >> (*(byte *)(lVar55 + uVar53) & 0x1f);
            bVar65 = false;
            if (*(int *)(literal_context_lut + 0x60) <= iVar47) {
              bVar66 = false;
              goto LAB_0010f589;
            }
            uVar10 = *(uint *)(lVar55 + 0x20 + uVar53 * 4);
            uVar11 = kBitMask[*(byte *)(lVar55 + uVar53)];
            lVar55 = *(long *)(lVar55 + 0xa8);
            uVar24 = BrotliGetTransforms();
            pvVar25 = malloc(uVar53 * 10);
            iVar20 = BrotliTransformDictionaryWord
                               (pvVar25,(ulong)uVar10 + lVar55 +
                                        (long)(int)((uVar19 & uVar11) * uVar48),uVar53,uVar24,iVar47
                               );
            sVar40 = (size_t)iVar20;
            iVar21 = bcmp(ringbuffer + uVar22,pvVar25,sVar40);
            bVar65 = false;
            bVar66 = false;
            iVar47 = 0;
            uVar33 = 0x7e4;
            auVar68 = _DAT_001360d0;
            if (iVar21 == 0) {
              iVar47 = 0x1f;
              if (uVar38 != 0) {
                for (; uVar38 >> iVar47 == 0; iVar47 = iVar47 + -1) {
                }
              }
              uVar33 = (ulong)(iVar47 * -0x1e + 0x780) + sVar40 * 0x87;
              iVar47 = uVar48 - iVar20;
              bVar65 = false;
              bVar66 = false;
              local_168 = (DictWord *)(long)(int)uVar38;
              local_188 = sVar40;
            }
          }
          else {
LAB_0010f580:
            bVar65 = false;
LAB_0010f589:
            iVar47 = 0;
            uVar33 = 0x7e4;
          }
          goto LAB_0010f58e;
        }
        uVar62 = (ulong)((long)pDVar61 - (long)local_168) & ringbuffer_mask;
        uVar53 = local_108 & 0xfffffffffffffff8;
        uVar26 = 0;
        lVar55 = 0;
        goto LAB_0010f4f3;
      }
      bVar65 = false;
      goto LAB_0010ec0d;
    }
    psVar44 = (size_t *)((long)psVar44 + 1);
    *(size_t **)backward_references = psVar44;
    psVar42 = psVar42 + 2;
  } while( true );
LAB_0010f2b7:
  if (lVar58 == 2) goto LAB_0010f4af;
  uVar53 = uVar53 + 1;
  *(ulong *)(lVar55 + 8) = uVar53;
  bVar30 = *(byte *)(lVar15 + uVar62);
  uVar26 = (ulong)bVar30;
  if ((uVar26 != 0) && (uVar26 <= local_108)) {
    uVar29 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar62 * 2);
    lVar16 = *(long *)(literal_context_lut + 0x58);
    lVar35 = uVar29 * uVar26 + *(long *)(lVar16 + 0xa8) +
             (ulong)*(uint *)(lVar16 + 0x20 + uVar26 * 4);
    uVar27 = (ulong)(bVar30 & 0xfffffff8);
    uVar32 = 0;
LAB_0010f323:
    if (uVar27 == uVar32) {
      uVar43 = (ulong)(bVar30 & 7);
      pcVar36 = (char *)(lVar35 + uVar32);
      for (; (bVar66 = uVar43 != 0, uVar43 = uVar43 - 1, uVar32 = uVar26, bVar66 &&
             (uVar32 = uVar27, *(char *)((long)puVar28 + uVar27) == *pcVar36)); uVar27 = uVar27 + 1)
      {
        pcVar36 = pcVar36 + 1;
      }
    }
    else {
      uVar43 = *(ulong *)(lVar35 + uVar32);
      if (uVar43 == *(ulong *)((long)puVar28 + uVar32)) goto code_r0x0010f33e;
      uVar43 = *(ulong *)((long)puVar28 + uVar32) ^ uVar43;
      uVar27 = 0;
      if (uVar43 != 0) {
        for (; (uVar43 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
        }
      }
      uVar32 = (uVar27 >> 3 & 0x1fffffff) + uVar32;
    }
    if (((uVar32 != 0) && (uVar26 < *(uint *)(literal_context_lut + 100) + uVar32)) &&
       (pDVar23 = (DictWord *)
                  (&local_c8->transform +
                  ((ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                                 ((char)(uVar26 - uVar32) * '\x06' & 0x3fU)) & 0x3f) +
                   (uVar26 - uVar32) * 4 << (*(byte *)(lVar16 + uVar26) & 0x3f)) + uVar29),
       pDVar23 <= pDVar41)) {
      iVar20 = 0x1f;
      if ((uint)pDVar23 != 0) {
        for (; (uint)pDVar23 >> iVar20 == 0; iVar20 = iVar20 + -1) {
        }
      }
      uVar26 = (uVar32 * 0x87 - (ulong)(uint)(iVar20 * 0x1e)) + 0x780;
      if (uVar33 <= uVar26) {
        iVar47 = (uint)bVar30 - (int)uVar32;
        local_138 = local_138 + 1;
        *(ulong *)(lVar55 + 0x10) = local_138;
        uVar33 = uVar26;
        local_168 = pDVar23;
        local_188 = uVar32;
      }
    }
  }
  lVar58 = lVar58 + 1;
  uVar62 = uVar62 + 1;
  goto LAB_0010f2b7;
LAB_0010f4af:
  bVar66 = true;
  goto LAB_0010f58e;
code_r0x0010f33e:
  uVar32 = uVar32 + 8;
  goto LAB_0010f323;
code_r0x0010eef6:
  lVar55 = lVar55 + -8;
  uVar53 = uVar53 + 1;
  goto LAB_0010eeda;
code_r0x0010ecf7:
  lVar55 = lVar55 + -8;
  uVar27 = uVar27 + 1;
  goto LAB_0010ecdb;
LAB_0010f4f3:
  if (local_108 >> 3 == uVar26) goto LAB_0010f87b;
  if (*(ulong *)(ringbuffer + uVar26 * 8 + uVar22) != *(ulong *)(ringbuffer + uVar26 * 8 + uVar62))
  {
    uVar62 = *(ulong *)(ringbuffer + uVar26 * 8 + uVar62) ^
             *(ulong *)(ringbuffer + uVar26 * 8 + uVar22);
    uVar53 = 0;
    if (uVar62 != 0) {
      for (; (uVar62 >> uVar53 & 1) == 0; uVar53 = uVar53 + 1) {
      }
    }
    uVar32 = (uVar53 >> 3 & 0x1fffffff) - lVar55;
    goto LAB_0010f53b;
  }
  lVar55 = lVar55 + -8;
  uVar26 = uVar26 + 1;
  goto LAB_0010f4f3;
LAB_0010f87b:
  uVar26 = (ulong)(uVar31 & 7);
  for (; (bVar65 = uVar26 != 0, uVar26 = uVar26 - 1, uVar32 = local_108, bVar65 &&
         (uVar32 = uVar53, ringbuffer[uVar53 + uVar62] == ringbuffer[uVar53 + uVar22]));
      uVar53 = uVar53 + 1) {
  }
LAB_0010f53b:
  local_188 = (long)*(int *)((long)psVar42 + 4);
  if (uVar32 < (ulong)(long)*(int *)((long)psVar42 + 4)) {
    local_188 = uVar32;
  }
  iVar47 = 0x1f;
  if (uVar38 != 0) {
    for (; uVar38 >> iVar47 == 0; iVar47 = iVar47 + -1) {
    }
  }
  uVar33 = (ulong)(iVar47 * -0x1e + 0x780) + local_188 * 0x87;
  bVar65 = false;
  bVar66 = false;
  iVar47 = 0;
LAB_0010f58e:
  if (0x1f < local_108) {
    for (pDVar41 = (params->dictionary).dict_words; pDVar41 <= pDVar61;
        pDVar41 = (DictWord *)&pDVar41->transform) {
      uVar38 = *(uint *)&(params->dictionary).hash_table_lengths;
      uVar48 = uVar38 & 0x3fffffff;
      *(uint *)&(params->dictionary).hash_table_lengths =
           uVar38 * params[1].quality + (uint)ringbuffer[(ulong)(pDVar41 + 8) & ringbuffer_mask] +
           ~(uint)ringbuffer[(ulong)pDVar41 & ringbuffer_mask] * params[1].lgwin + 1;
      if (uVar48 < 0x1000000) {
        puVar14 = (params->dictionary).buckets;
        uVar38 = *(uint *)(puVar14 + (ulong)uVar48 * 2);
        *(int *)(puVar14 + (ulong)uVar48 * 2) = (int)pDVar41;
        if ((pDVar41 == pDVar61) && (uVar38 != 0xffffffff)) {
          uVar48 = (int)pDVar61 - uVar38;
          if ((DictWord *)(ulong)uVar48 <= pDVar45) {
            uVar53 = 0;
            lVar55 = 0;
LAB_0010f656:
            uVar62 = local_108 & 0xfffffffffffffff8;
            uVar26 = (ulong)(uVar31 & 7);
            if (local_108 >> 3 == uVar53) {
              for (; (uVar53 = local_108, uVar26 != 0 &&
                     (uVar53 = uVar62,
                     ringbuffer[uVar62 + (uVar38 & uVar39)] == ringbuffer[uVar62 + uVar22]));
                  uVar62 = uVar62 + 1) {
                uVar26 = uVar26 - 1;
              }
            }
            else {
              if (*(ulong *)(ringbuffer + uVar53 * 8 + uVar22) ==
                  *(ulong *)(ringbuffer + uVar53 * 8 + (ulong)(uVar38 & uVar39)))
              goto code_r0x0010f66d;
              uVar62 = *(ulong *)(ringbuffer + uVar53 * 8 + (ulong)(uVar38 & uVar39)) ^
                       *(ulong *)(ringbuffer + uVar53 * 8 + uVar22);
              uVar53 = 0;
              if (uVar62 != 0) {
                for (; (uVar62 >> uVar53 & 1) == 0; uVar53 = uVar53 + 1) {
                }
              }
              uVar53 = (uVar53 >> 3 & 0x1fffffff) - lVar55;
            }
            if ((3 < uVar53) && (local_188 < uVar53)) {
              iVar20 = 0x1f;
              if (uVar48 != 0) {
                for (; uVar48 >> iVar20 == 0; iVar20 = iVar20 + -1) {
                }
              }
              uVar62 = (ulong)(iVar20 * -0x1e + 0x780) + uVar53 * 0x87;
              if (uVar33 < uVar62) {
                iVar47 = 0;
                uVar33 = uVar62;
                local_188 = uVar53;
                local_168 = (DictWord *)(ulong)uVar48;
              }
            }
          }
        }
      }
    }
    (params->dictionary).dict_words = (DictWord *)&pDVar61->transform;
  }
  if (uVar33 < 0x7e5) {
    local_110 = local_110 + 1;
    position = (size_t)&pDVar61->transform;
    if (bVar65 && puVar59 < position) {
      if (puVar59 + (uint)((int)lVar50 * 4) < position) {
        pDVar45 = (DictWord *)&pDVar61[4].transform;
        if (pDVar6 <= &pDVar61[4].transform) {
          pDVar45 = pDVar6;
        }
        for (; position < pDVar45; position = position + 4) {
          uVar53._0_4_ = (params->dist).alphabet_size_max;
          uVar53._4_4_ = (params->dist).alphabet_size_limit;
          uVar13 = (params->dictionary).cutoffTransforms;
          bVar30 = *(byte *)((long)&(params->dist).max_distance + 4);
          uVar22 = (*(ulong *)(ringbuffer + (position & ringbuffer_mask)) & uVar53) *
                   0x1fe35a7bd3579bd3 >> ((byte)(params->dist).distance_postfix_bits & 0x3f);
          uVar53 = uVar22 & 0xffffffff;
          uVar9 = *(ushort *)(uVar13 + uVar53 * 2);
          sVar18 = (params->dist).max_distance;
          puVar14 = (params->dictionary).hash_table_words;
          *(ushort *)(uVar13 + uVar53 * 2) = uVar9 + 1;
          *(int *)(puVar14 +
                  (ulong)((uint)sVar18 & (uint)uVar9) * 2 +
                  (ulong)(uint)((int)uVar22 << (bVar30 & 0x1f)) * 2) = (int)position;
          local_110 = local_110 + 4;
        }
      }
      else {
        pDVar45 = (DictWord *)&pDVar61[2].transform;
        if (pDVar6 <= &pDVar61[2].transform) {
          pDVar45 = pDVar6;
        }
        for (; position < pDVar45; position = (size_t)&((DictWord *)position)->idx) {
          uVar22._0_4_ = (params->dist).alphabet_size_max;
          uVar22._4_4_ = (params->dist).alphabet_size_limit;
          uVar13 = (params->dictionary).cutoffTransforms;
          bVar30 = *(byte *)((long)&(params->dist).max_distance + 4);
          uVar22 = (*(ulong *)(ringbuffer + (position & ringbuffer_mask)) & uVar22) *
                   0x1fe35a7bd3579bd3 >> ((byte)(params->dist).distance_postfix_bits & 0x3f);
          uVar53 = uVar22 & 0xffffffff;
          uVar9 = *(ushort *)(uVar13 + uVar53 * 2);
          sVar18 = (params->dist).max_distance;
          puVar14 = (params->dictionary).hash_table_words;
          *(ushort *)(uVar13 + uVar53 * 2) = uVar9 + 1;
          *(int *)(puVar14 +
                  (ulong)((uint)sVar18 & (uint)uVar9) * 2 +
                  (ulong)(uint)((int)uVar22 << (bVar30 & 0x1f)) * 2) = (int)position;
          local_110 = local_110 + 2;
        }
      }
    }
    goto LAB_0010eb1b;
  }
  if (bVar66) {
    uVar13 = (params->dictionary).cutoffTransforms;
    puVar14 = (params->dictionary).hash_table_words;
    uVar53 = (lVar5 + num_bytes) - (long)pDVar61;
    uVar31 = 0;
    pDVar45 = local_168;
    pDVar41 = pDVar61;
    uVar22 = local_188;
    iVar20 = iVar47;
LAB_0010f8f1:
    uVar32 = (ulong)((uint)uVar53 & 7);
    uVar26 = uVar53 >> 3;
    local_108 = local_108 - 1;
    uVar62 = uVar22 - 1;
    if (local_108 <= uVar22 - 1) {
      uVar62 = local_108;
    }
    if (4 < *(int *)(literal_context_lut + 4)) {
      uVar62 = 0;
    }
    pDVar61 = (DictWord *)&pDVar41->transform;
    pDVar23 = pDVar7;
    if (pDVar61 < pDVar7) {
      pDVar23 = pDVar61;
    }
    local_c8 = (DictWord *)(&pDVar41->transform + lVar12);
    if (pDVar7 <= (DictWord *)(&pDVar41->transform + lVar12)) {
      local_c8 = pDVar7;
    }
    pDVar51 = *(DictWord **)(literal_context_lut + 0x50);
    uVar27 = (ulong)pDVar61 & ringbuffer_mask;
    psVar44 = *(size_t **)backward_references;
    psVar42 = num_literals + (long)psVar44 * 2;
LAB_0010f9be:
    if (back_refs_position <= psVar44) {
LAB_0010f9e9:
      puVar28 = (ulong *)(ringbuffer + uVar27);
      uVar29 = 0x7e4;
      pDVar52 = (DictWord *)0x0;
      local_188 = 0;
      for (uVar43 = 0; uVar43 != (long)*(int *)&(params->dictionary).words; uVar43 = uVar43 + 1) {
        pDVar60 = (DictWord *)(long)*(int *)((long)&(hasher->common).extra + uVar43 * 4);
        if (((pDVar60 <= pDVar23) && ((uint8_t *)((long)pDVar61 + -(long)pDVar60) < pDVar61)) &&
           (uVar27 + uVar62 <= ringbuffer_mask)) {
          uVar34 = (ulong)((long)pDVar61 + -(long)pDVar60) & ringbuffer_mask;
          if ((uVar34 + uVar62 <= ringbuffer_mask) &&
             (ringbuffer[uVar27 + uVar62] == ringbuffer[uVar34 + uVar62])) {
            uVar63 = 0;
            lVar55 = 0;
LAB_0010fa9a:
            if (uVar26 == uVar63) {
              uVar64 = uVar32;
              for (uVar63 = -lVar55;
                  (bVar66 = uVar64 != 0, uVar64 = uVar64 - 1, bVar66 &&
                  (ringbuffer[uVar63 + uVar34] == *(uint8_t *)((long)puVar28 + uVar63)));
                  uVar63 = uVar63 + 1) {
              }
            }
            else {
              if (puVar28[uVar63] == *(ulong *)(ringbuffer + uVar63 * 8 + uVar34))
              goto code_r0x0010fabb;
              uVar63 = *(ulong *)(ringbuffer + uVar63 * 8 + uVar34) ^ puVar28[uVar63];
              uVar34 = 0;
              if (uVar63 != 0) {
                for (; (uVar63 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                }
              }
              uVar63 = (uVar34 >> 3 & 0x1fffffff) - lVar55;
            }
            if ((psVar44 < back_refs_position && !bVar65) &&
               ((undefined1 *)(long)(int)*psVar42 < (uint8_t *)((long)pDVar61 + uVar63))) {
              uVar63 = (long)(int)*psVar42 - (long)pDVar61;
            }
            if (((2 < uVar63) || ((uVar43 < 2 && (uVar63 == 2)))) &&
               (uVar34 = uVar63 * 0x87 + 0x78f, uVar29 < uVar34)) {
              if (uVar43 != 0) {
                uVar34 = uVar34 - ((0x1ca10U >> ((byte)uVar43 & 0xe) & 0xe) + 0x27);
              }
              if (uVar29 < uVar34) {
                uVar29 = uVar34;
                pDVar52 = pDVar60;
                uVar62 = uVar63;
                local_188 = uVar63;
              }
            }
          }
        }
      }
      uVar43 = *puVar28;
      uVar34._0_4_ = (params->dist).alphabet_size_max;
      uVar34._4_4_ = (params->dist).alphabet_size_limit;
      uVar34 = (uVar34 & uVar43) * 0x1fe35a7bd3579bd3 >>
               ((byte)(params->dist).distance_postfix_bits & 0x3f);
      uVar63 = uVar34 & 0xffffffff;
      uVar38 = (int)uVar34 << (*(byte *)((long)&(params->dist).max_distance + 4) & 0x1f);
      uVar9 = *(ushort *)(uVar13 + uVar63 * 2);
      uVar64 = (ulong)uVar9;
      piVar1 = &(params->hasher).num_last_distances_to_check;
      uVar34 = 0;
      if (*(ulong *)piVar1 <= uVar64) {
        uVar34 = uVar64 - *(long *)piVar1;
      }
      uVar48 = (uint)(params->dist).max_distance;
      uVar57 = local_188;
      do {
        local_188 = uVar57;
        uVar56 = uVar62;
        local_168 = pDVar52;
        uVar54 = uVar29;
        uVar4 = uVar56 + uVar27;
        do {
          do {
            do {
              do {
                if (uVar64 <= uVar34) {
LAB_0010fd69:
                  *(int *)(puVar14 + (ulong)uVar38 * 2 + (ulong)(uVar48 & uVar9) * 2) = (int)pDVar61
                  ;
                  *(ushort *)(uVar13 + uVar63 * 2) = uVar9 + 1;
                  bVar66 = false;
                  if (uVar54 != 0x7e4) {
                    bVar30 = 1;
                    iVar47 = 0;
                    goto LAB_001103bd;
                  }
                  if (bVar65) {
                    bVar30 = 1;
                    lVar55 = *(long *)&(params->dictionary).num_transforms;
                    uVar62 = *(ulong *)(lVar55 + 8);
                    local_e0 = *(ulong *)(lVar55 + 0x10);
                    if (uVar62 >> 7 <= local_e0) {
                      local_50 = (int)uVar43;
                      uVar29 = (ulong)((uint)(local_50 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
                      lVar15 = *(long *)(literal_context_lut + 0x78);
                      uVar54 = 0x7e4;
                      iVar47 = 0;
                      lVar58 = 0;
                      goto LAB_0010fe45;
                    }
                  }
                  else if (psVar44 < back_refs_position) goto LAB_001100f0;
                  bVar30 = 1;
                  uVar54 = 0x7e4;
                  bVar66 = false;
                  iVar47 = 0;
                  goto LAB_001103bd;
                }
                uVar64 = uVar64 - 1;
                uVar19 = *(uint *)(puVar14 + (ulong)uVar38 * 2 + (ulong)((uint)uVar64 & uVar48) * 2)
                ;
                pDVar52 = (DictWord *)((long)pDVar61 + -(ulong)uVar19);
                if (pDVar23 < pDVar52) goto LAB_0010fd69;
              } while (ringbuffer_mask < uVar4);
              uVar29 = (ulong)(uVar19 & uVar39);
              uVar62 = uVar29 + uVar56;
            } while ((ringbuffer_mask < uVar62) || (ringbuffer[uVar4] != ringbuffer[uVar62]));
            uVar62 = 0;
            lVar55 = 0;
LAB_0010fc98:
            if (uVar26 == uVar62) {
              uVar57 = uVar32;
              for (uVar62 = -lVar55;
                  (bVar66 = uVar57 != 0, uVar57 = uVar57 - 1, bVar66 &&
                  (ringbuffer[uVar62 + uVar29] == *(uint8_t *)((long)puVar28 + uVar62)));
                  uVar62 = uVar62 + 1) {
              }
            }
            else {
              if (puVar28[uVar62] == *(ulong *)(ringbuffer + uVar62 * 8 + uVar29))
              goto code_r0x0010fcb8;
              uVar29 = *(ulong *)(ringbuffer + uVar62 * 8 + uVar29) ^ puVar28[uVar62];
              uVar62 = 0;
              if (uVar29 != 0) {
                for (; (uVar29 >> uVar62 & 1) == 0; uVar62 = uVar62 + 1) {
                }
              }
              uVar62 = (uVar62 >> 3 & 0x1fffffff) - lVar55;
            }
            if ((psVar44 < back_refs_position && !bVar65) &&
               ((undefined1 *)(long)(int)*psVar42 < (uint8_t *)((long)pDVar61 + uVar62))) {
              uVar62 = (long)(int)*psVar42 - (long)pDVar61;
            }
          } while (uVar62 < 4);
          iVar47 = 0x1f;
          if ((uint)pDVar52 != 0) {
            for (; (uint)pDVar52 >> iVar47 == 0; iVar47 = iVar47 + -1) {
            }
          }
          uVar29 = (ulong)(iVar47 * -0x1e + 0x780) + uVar62 * 0x87;
          uVar57 = uVar62;
        } while (uVar29 <= uVar54);
      } while( true );
    }
    if ((undefined1 *)(long)(int)*psVar42 < pDVar61) {
      psVar44 = (size_t *)((long)psVar44 + 1);
      *(size_t **)backward_references = psVar44;
      psVar42 = psVar42 + 2;
      goto LAB_0010f9be;
    }
    if (pDVar61 != (DictWord *)(long)(int)*psVar42 || bVar65) goto LAB_0010f9e9;
    uVar38 = (uint)psVar42[1];
    local_168 = (DictWord *)(long)(int)uVar38;
    if (pDVar61 <= (uint8_t *)((long)pDVar61 + -(long)local_168)) {
      local_188 = 0;
      local_168 = (DictWord *)0x0;
      goto LAB_001100f0;
    }
    if (uVar38 <= *(uint *)((long)psVar42 + 0xc)) {
      uVar62 = (ulong)((long)pDVar61 + -(long)local_168) & ringbuffer_mask;
      uVar29 = 0;
      lVar55 = 0;
      goto LAB_0011029e;
    }
    local_188 = 0;
    local_168 = (DictWord *)0x0;
LAB_001100f0:
    uVar54 = 0x7e4;
    bVar30 = 1;
    if (pDVar61 == (DictWord *)(long)(int)*psVar42) {
      uVar38 = (uint)psVar42[1];
      if ((int)uVar38 <= *(int *)((long)psVar42 + 0xc)) goto LAB_00110262;
      uVar48 = *(uint *)((long)psVar42 + 4);
      uVar62 = (ulong)uVar48;
      if (uVar48 - 4 < 0x15 && (int)uVar38 < 0x7ffffffd) {
        uVar19 = ~(uint)pDVar23 + uVar38;
        lVar55 = *(long *)(literal_context_lut + 0x58);
        iVar47 = (int)uVar19 >> (*(byte *)(lVar55 + uVar62) & 0x1f);
        if (iVar47 < *(int *)(literal_context_lut + 0x60)) {
          uVar10 = *(uint *)(lVar55 + 0x20 + uVar62 * 4);
          uVar11 = kBitMask[*(byte *)(lVar55 + uVar62)];
          lVar55 = *(long *)(lVar55 + 0xa8);
          uVar24 = BrotliGetTransforms();
          pvVar25 = malloc(uVar62 * 10);
          iVar47 = BrotliTransformDictionaryWord
                             (pvVar25,(ulong)uVar10 + lVar55 +
                                      (long)(int)((uVar19 & uVar11) * uVar48),uVar48,uVar24,iVar47);
          sVar40 = (size_t)iVar47;
          iVar21 = bcmp(ringbuffer + uVar27,pvVar25,sVar40);
          auVar68 = _DAT_001360d0;
          if (iVar21 == 0) {
            iVar21 = 0x1f;
            if (uVar38 != 0) {
              for (; uVar38 >> iVar21 == 0; iVar21 = iVar21 + -1) {
              }
            }
            uVar54 = (ulong)(iVar21 * -0x1e + 0x780) + sVar40 * 0x87;
            iVar47 = uVar48 - iVar47;
            local_168 = (DictWord *)(long)(int)uVar38;
            local_188 = sVar40;
          }
          else {
            iVar47 = 0;
            uVar54 = 0x7e4;
          }
        }
        else {
          iVar47 = 0;
        }
      }
      else {
        iVar47 = 0;
      }
      bVar30 = 0;
      bVar66 = true;
    }
    else {
LAB_00110262:
      iVar47 = 0;
      bVar66 = false;
    }
    goto LAB_001103bd;
  }
LAB_00110655:
  if (local_c8 < local_168) {
LAB_0011067c:
    puStack_190 = (undefined1 *)((long)&local_168[3].idx + 1);
  }
  else {
    pDVar45 = (DictWord *)(long)*(int *)&(hasher->common).extra;
    if (local_168 == pDVar45) {
      puStack_190 = (undefined1 *)0x0;
      goto LAB_0011071f;
    }
    pDVar41 = (DictWord *)(long)*(int *)((long)&(hasher->common).extra + 4);
    puStack_190 = (undefined1 *)0x1;
    if (local_168 != pDVar41) {
      uVar22 = (long)local_168 + (3 - (long)pDVar45);
      if (uVar22 < 7) {
        bVar30 = (byte)((int)uVar22 << 2);
        uVar31 = 0x9750468;
      }
      else {
        uVar22 = (long)local_168 + (3 - (long)pDVar41);
        if (6 < uVar22) {
          puStack_190 = (undefined1 *)0x2;
          if ((local_168 != (DictWord *)(long)(int)(hasher->common).dict_num_lookups) &&
             (puStack_190 = (undefined1 *)0x3,
             local_168 != (DictWord *)(long)*(int *)((long)&(hasher->common).dict_num_lookups + 4)))
          goto LAB_0011067c;
          goto LAB_00110680;
        }
        bVar30 = (byte)((int)uVar22 << 2);
        uVar31 = 0xfdb1ace;
      }
      puStack_190 = (undefined1 *)(ulong)(uVar31 >> (bVar30 & 0x1f) & 0xf);
    }
  }
LAB_00110680:
  if ((local_168 <= local_c8) && (puStack_190 != (undefined1 *)0x0)) {
    *(int *)((long)&(hasher->common).dict_num_lookups + 4) = (int)(hasher->common).dict_num_lookups;
    pvVar25 = (hasher->common).extra;
    *(void **)((long)&(hasher->common).extra + 4) = pvVar25;
    iVar20 = (int)local_168;
    *(int *)&(hasher->common).extra = iVar20;
    uVar31 = *(uint *)&(params->dictionary).words;
    if (4 < (int)uVar31) {
      *(int *)&(hasher->common).dict_num_matches = iVar20 + auVar68._0_4_;
      *(int *)((long)&(hasher->common).dict_num_matches + 4) = iVar20 + auVar68._4_4_;
      (hasher->common).params.type = iVar20 + auVar68._8_4_;
      (hasher->common).params.bucket_bits = iVar20 + auVar68._12_4_;
      (hasher->common).params.block_bits = iVar20 + -3;
      (hasher->common).params.hash_len = iVar20 + 3;
      if (10 < uVar31) {
        iVar20 = (int)pvVar25;
        (hasher->common).params.num_last_distances_to_check = iVar20 + auVar68._0_4_;
        (hasher->common).is_prepared_ = iVar20 + auVar68._4_4_;
        *(int *)&hasher->privat = iVar20 + auVar68._8_4_;
        *(int *)((long)&hasher->privat + 4) = iVar20 + auVar68._12_4_;
        (hasher->privat)._H5.block_size_ = CONCAT44(iVar20 + 3,iVar20 + -3);
      }
    }
  }
LAB_0011071f:
  uVar31 = (uint)local_110;
  *(uint *)local_c0 = uVar31;
  *(uint *)((long)local_c0 + 4) = iVar47 << 0x19 | (uint)local_188;
  puVar2 = (undefined1 *)((ulong)*(uint *)(literal_context_lut + 0x44) + 0x10);
  uVar39 = 0;
  if (puVar2 <= puStack_190) {
    bVar30 = (byte)*(uint *)(literal_context_lut + 0x40);
    puVar46 = puStack_190 +
              ((4L << (bVar30 & 0x3f)) - (ulong)*(uint *)(literal_context_lut + 0x44)) + -0x10;
    uVar39 = 0x1f;
    uVar38 = (uint)puVar46;
    if (uVar38 != 0) {
      for (; uVar38 >> uVar39 == 0; uVar39 = uVar39 - 1) {
      }
    }
    uVar39 = (uVar39 ^ 0xffffffe0) + 0x1f;
    uVar22 = (ulong)(((ulong)puVar46 >> ((ulong)uVar39 & 0x3f) & 1) != 0);
    lVar55 = (ulong)uVar39 - (ulong)*(uint *)(literal_context_lut + 0x40);
    puStack_190 = (undefined1 *)
                  ((ulong)(puVar2 + (uVar22 + lVar55 * 2 + 0xfffe << (bVar30 & 0x3f)) +
                                    (ulong)(~(-1 << (bVar30 & 0x1f)) & uVar38)) | lVar55 * 0x400);
    uVar39 = (uint)((long)puVar46 - (uVar22 + 2 << ((byte)uVar39 & 0x3f)) >> (bVar30 & 0x3f));
  }
  *(short *)((long)local_c0 + 0xe) = (short)puStack_190;
  *(uint *)(local_c0 + 1) = uVar39;
  if (5 < local_110) {
    if (local_110 < 0x82) {
      uVar31 = 0x1f;
      uVar39 = (uint)(local_110 - 2);
      if (uVar39 != 0) {
        for (; uVar39 >> uVar31 == 0; uVar31 = uVar31 - 1) {
        }
      }
      uVar31 = (int)(local_110 - 2 >> ((char)(uVar31 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar31 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (local_110 < 0x842) {
      uVar39 = 0x1f;
      if (uVar31 - 0x42 != 0) {
        for (; uVar31 - 0x42 >> uVar39 == 0; uVar39 = uVar39 - 1) {
        }
      }
      uVar31 = (uVar39 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar31 = 0x15;
      if (0x1841 < local_110) {
        uVar31 = (uint)(ushort)(0x17 - (local_110 < 0x5842));
      }
    }
  }
  uVar39 = iVar47 + (uint)local_188;
  if (uVar39 < 10) {
    uVar38 = uVar39 - 2;
  }
  else if (uVar39 < 0x86) {
    uVar39 = uVar39 - 6;
    uVar38 = 0x1f;
    if (uVar39 != 0) {
      for (; uVar39 >> uVar38 == 0; uVar38 = uVar38 - 1) {
      }
    }
    uVar38 = (uVar39 >> ((char)(uVar38 ^ 0xffffffe0) + 0x1fU & 0x1f)) + (uVar38 ^ 0xffffffe0) * 2 +
             0x42;
  }
  else {
    uVar38 = 0x17;
    if (uVar39 < 0x846) {
      uVar38 = 0x1f;
      if (uVar39 - 0x46 != 0) {
        for (; uVar39 - 0x46 >> uVar38 == 0; uVar38 = uVar38 - 1) {
        }
      }
      uVar38 = (uVar38 ^ 0xffe0) + 0x2c;
    }
  }
  uVar9 = (ushort)uVar38;
  sVar37 = (uVar9 & 7) + ((ushort)uVar31 & 7) * 8;
  if (((((ulong)puStack_190 & 0x3ff) == 0) && ((ushort)uVar31 < 8)) && (uVar9 < 0x10)) {
    if (7 < uVar9) {
      sVar37 = sVar37 + 0x40;
    }
  }
  else {
    iVar47 = ((uVar31 & 0xffff) >> 3) * 3 + ((uVar38 & 0xffff) >> 3);
    sVar37 = sVar37 + ((ushort)(0x520d40 >> ((char)iVar47 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar47 * 0x40 + 0x40;
  }
  *(short *)((long)local_c0 + 0xc) = sVar37;
  *num_commands = *num_commands + local_110;
  position = (size_t)(&pDVar61->len + local_188);
  pDVar45 = pDVar49;
  if (position < pDVar49) {
    pDVar45 = (DictWord *)position;
  }
  pDVar41 = (DictWord *)&pDVar61->idx;
  if (local_168 < (DictWord *)(local_188 >> 2)) {
    pDVar23 = (DictWord *)(position + -(long)local_168 * 4);
    if ((DictWord *)(position + -(long)local_168 * 4) < pDVar41) {
      pDVar23 = pDVar41;
    }
    pDVar41 = pDVar23;
    if (pDVar45 < pDVar23) {
      pDVar41 = pDVar45;
    }
  }
  puVar59 = &pDVar61->len + lVar50 + local_188 * 2;
  local_c0 = local_c0 + 2;
  for (; pDVar41 < pDVar45; pDVar41 = (DictWord *)&pDVar41->transform) {
    uVar13 = (params->dictionary).cutoffTransforms;
    uVar62._0_4_ = (params->dist).alphabet_size_max;
    uVar62._4_4_ = (params->dist).alphabet_size_limit;
    uVar53 = (*(ulong *)(ringbuffer + ((ulong)pDVar41 & ringbuffer_mask)) & uVar62) *
             0x1fe35a7bd3579bd3 >> ((byte)(params->dist).distance_postfix_bits & 0x3f);
    bVar30 = *(byte *)((long)&(params->dist).max_distance + 4);
    uVar22 = uVar53 & 0xffffffff;
    uVar9 = *(ushort *)(uVar13 + uVar22 * 2);
    sVar18 = (params->dist).max_distance;
    puVar14 = (params->dictionary).hash_table_words;
    *(ushort *)(uVar13 + uVar22 * 2) = uVar9 + 1;
    *(int *)(puVar14 +
            (ulong)((uint)sVar18 & (uint)uVar9) * 2 +
            (ulong)(uint)((int)uVar53 << (bVar30 & 0x1f)) * 2) = (int)pDVar41;
  }
  local_110 = 0;
  goto LAB_0010eb0b;
code_r0x0010f66d:
  lVar55 = lVar55 + -8;
  uVar53 = uVar53 + 1;
  goto LAB_0010f656;
code_r0x0010fabb:
  lVar55 = lVar55 + -8;
  uVar63 = uVar63 + 1;
  goto LAB_0010fa9a;
code_r0x0010fcb8:
  lVar55 = lVar55 + -8;
  uVar62 = uVar62 + 1;
  goto LAB_0010fc98;
LAB_0010fe45:
  if (lVar58 == 2) goto LAB_001100c2;
  uVar62 = uVar62 + 1;
  *(ulong *)(lVar55 + 8) = uVar62;
  bVar8 = *(byte *)(lVar15 + uVar29);
  uVar43 = (ulong)bVar8;
  if ((uVar43 != 0) && (uVar43 <= local_108)) {
    uVar64 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar29 * 2);
    lVar16 = *(long *)(literal_context_lut + 0x58);
    lVar35 = uVar64 * uVar43 + *(long *)(lVar16 + 0xa8) +
             (ulong)*(uint *)(lVar16 + 0x20 + uVar43 * 4);
    uVar63 = (ulong)(bVar8 & 0xfffffff8);
    uVar34 = 0;
LAB_0010feb8:
    if (uVar63 == uVar34) {
      uVar57 = (ulong)(bVar8 & 7);
      pcVar36 = (char *)(lVar35 + uVar34);
      for (; (bVar66 = uVar57 != 0, uVar57 = uVar57 - 1, uVar34 = uVar43, bVar66 &&
             (uVar34 = uVar63, *(char *)((long)puVar28 + uVar63) == *pcVar36)); uVar63 = uVar63 + 1)
      {
        pcVar36 = pcVar36 + 1;
      }
    }
    else {
      uVar57 = *(ulong *)(lVar35 + uVar34);
      if (uVar57 == *(ulong *)((long)puVar28 + uVar34)) goto code_r0x0010fed4;
      uVar57 = *(ulong *)((long)puVar28 + uVar34) ^ uVar57;
      uVar63 = 0;
      if (uVar57 != 0) {
        for (; (uVar57 >> uVar63 & 1) == 0; uVar63 = uVar63 + 1) {
        }
      }
      uVar34 = (uVar63 >> 3 & 0x1fffffff) + uVar34;
    }
    if (((uVar34 != 0) && (uVar43 < *(uint *)(literal_context_lut + 100) + uVar34)) &&
       (pDVar52 = (DictWord *)
                  (&local_c8->transform +
                  ((ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                                 ((char)(uVar43 - uVar34) * '\x06' & 0x3fU)) & 0x3f) +
                   (uVar43 - uVar34) * 4 << (*(byte *)(lVar16 + uVar43) & 0x3f)) + uVar64),
       pDVar52 <= pDVar51)) {
      iVar21 = 0x1f;
      if ((uint)pDVar52 != 0) {
        for (; (uint)pDVar52 >> iVar21 == 0; iVar21 = iVar21 + -1) {
        }
      }
      uVar43 = (uVar34 * 0x87 - (ulong)(uint)(iVar21 * 0x1e)) + 0x780;
      if (uVar54 <= uVar43) {
        iVar47 = (uint)bVar8 - (int)uVar34;
        local_e0 = local_e0 + 1;
        *(ulong *)(lVar55 + 0x10) = local_e0;
        uVar54 = uVar43;
        local_168 = pDVar52;
        local_188 = uVar34;
      }
    }
  }
  lVar58 = lVar58 + 1;
  uVar29 = uVar29 + 1;
  goto LAB_0010fe45;
LAB_001100c2:
  bVar66 = false;
  goto LAB_001103bd;
code_r0x0010fed4:
  uVar34 = uVar34 + 8;
  goto LAB_0010feb8;
LAB_0011029e:
  if (uVar26 == uVar29) goto LAB_001105d3;
  if (*(ulong *)(ringbuffer + uVar29 * 8 + uVar27) != *(ulong *)(ringbuffer + uVar29 * 8 + uVar62))
  {
    uVar29 = *(ulong *)(ringbuffer + uVar29 * 8 + uVar62) ^
             *(ulong *)(ringbuffer + uVar29 * 8 + uVar27);
    uVar62 = 0;
    if (uVar29 != 0) {
      for (; (uVar29 >> uVar62 & 1) == 0; uVar62 = uVar62 + 1) {
      }
    }
    uVar43 = (uVar62 >> 3 & 0x1fffffff) - lVar55;
    goto LAB_001102df;
  }
  lVar55 = lVar55 + -8;
  uVar29 = uVar29 + 1;
  goto LAB_0011029e;
LAB_001105d3:
  uVar29 = uVar32;
  for (uVar43 = -lVar55;
      (bVar66 = uVar29 != 0, uVar29 = uVar29 - 1, bVar66 &&
      (ringbuffer[uVar43 + uVar62] == ringbuffer[uVar43 + uVar27])); uVar43 = uVar43 + 1) {
  }
LAB_001102df:
  local_188 = (long)*(int *)((long)psVar42 + 4);
  if (uVar43 < (ulong)(long)*(int *)((long)psVar42 + 4)) {
    local_188 = uVar43;
  }
  iVar47 = 0x1f;
  if (uVar38 != 0) {
    for (; uVar38 >> iVar47 == 0; iVar47 = iVar47 + -1) {
    }
  }
  uVar54 = (ulong)(iVar47 * -0x1e + 0x780) + local_188 * 0x87;
  bVar30 = 0;
  iVar47 = 0;
  bVar66 = true;
LAB_001103bd:
  if (0x1f < local_108) {
    local_120 = local_168;
    for (pDVar51 = (params->dictionary).dict_words; pDVar51 <= pDVar61;
        pDVar51 = (DictWord *)&pDVar51->transform) {
      uVar38 = *(uint *)&(params->dictionary).hash_table_lengths;
      uVar48 = uVar38 & 0x3fffffff;
      *(uint *)&(params->dictionary).hash_table_lengths =
           uVar38 * params[1].quality + (uint)ringbuffer[(ulong)(pDVar51 + 8) & ringbuffer_mask] +
           ~(uint)ringbuffer[(ulong)pDVar51 & ringbuffer_mask] * params[1].lgwin + 1;
      if (uVar48 < 0x1000000) {
        puVar17 = (params->dictionary).buckets;
        uVar38 = *(uint *)(puVar17 + (ulong)uVar48 * 2);
        *(int *)(puVar17 + (ulong)uVar48 * 2) = (int)pDVar51;
        if ((pDVar51 == pDVar61) && (uVar38 != 0xffffffff)) {
          uVar48 = (int)pDVar61 - uVar38;
          if ((DictWord *)(ulong)uVar48 <= pDVar23) {
            uVar62 = 0;
            lVar55 = 0;
LAB_00110475:
            if (uVar26 == uVar62) {
              uVar29 = uVar32;
              for (uVar62 = -lVar55;
                  (bVar67 = uVar29 != 0, uVar29 = uVar29 - 1, bVar67 &&
                  (ringbuffer[uVar62 + (uVar38 & uVar39)] == ringbuffer[uVar62 + uVar27]));
                  uVar62 = uVar62 + 1) {
              }
            }
            else {
              if (*(ulong *)(ringbuffer + uVar62 * 8 + uVar27) ==
                  *(ulong *)(ringbuffer + uVar62 * 8 + (ulong)(uVar38 & uVar39)))
              goto code_r0x00110491;
              uVar29 = *(ulong *)(ringbuffer + uVar62 * 8 + (ulong)(uVar38 & uVar39)) ^
                       *(ulong *)(ringbuffer + uVar62 * 8 + uVar27);
              uVar62 = 0;
              if (uVar29 != 0) {
                for (; (uVar29 >> uVar62 & 1) == 0; uVar62 = uVar62 + 1) {
                }
              }
              uVar62 = (uVar62 >> 3 & 0x1fffffff) - lVar55;
            }
            if ((3 < uVar62) && (local_188 < uVar62)) {
              iVar21 = 0x1f;
              if (uVar48 != 0) {
                for (; uVar48 >> iVar21 == 0; iVar21 = iVar21 + -1) {
                }
              }
              uVar29 = (ulong)(iVar21 * -0x1e + 0x780) + uVar62 * 0x87;
              if (uVar54 < uVar29) {
                iVar47 = 0;
                uVar54 = uVar29;
                local_188 = uVar62;
                local_120 = (DictWord *)(ulong)uVar48;
              }
            }
          }
        }
      }
    }
    (params->dictionary).dict_words = (DictWord *)&pDVar41->idx;
    local_168 = local_120;
  }
  if (!bVar66 && uVar54 < uVar33 + 0xaf) {
    local_188 = uVar22;
    local_168 = pDVar45;
    pDVar61 = pDVar41;
    local_c8 = (DictWord *)(&pDVar41->len + lVar12);
    iVar47 = iVar20;
    if (pDVar7 <= (DictWord *)(&pDVar41->len + lVar12)) {
      local_c8 = pDVar7;
    }
    goto LAB_00110655;
  }
  local_110 = local_110 + 1;
  if (!(bool)(bVar30 & uVar31 < 3)) goto LAB_00110655;
  uVar31 = uVar31 + 1;
  pDVar23 = pDVar41 + 2;
  uVar53 = uVar53 - 1;
  uVar33 = uVar54;
  pDVar45 = local_168;
  pDVar41 = pDVar61;
  uVar22 = local_188;
  iVar20 = iVar47;
  if (pDVar3 <= &pDVar23->transform) goto LAB_00110655;
  goto LAB_0010f8f1;
code_r0x00110491:
  lVar55 = lVar55 + -8;
  uVar62 = uVar62 + 1;
  goto LAB_00110475;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals,
    const BackwardReferenceFromDecoder* backward_references,
    size_t* back_refs_position, size_t back_refs_size) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  BROTLI_UNUSED(literal_context_lut);

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    sr.used_stored = BROTLI_FALSE;
    FN(FindLongestMatch)(privat, &params->dictionary,
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance,
        backward_references, back_refs_position, back_refs_size, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      /* If a reference from backward_references array was found
         then just take it */
      if (!sr.used_stored) {
          for (;; --max_length) {
            const score_t cost_diff_lazy = 175;
            HasherSearchResult sr2;
            sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
                BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
            sr2.len_code_delta = 0;
            sr2.distance = 0;
            sr2.score = kMinScore;
            sr2.used_stored = BROTLI_FALSE;
            max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
            dictionary_start = BROTLI_MIN(size_t,
                position + 1 + position_offset, max_backward_limit);
            FN(FindLongestMatch)(privat,
                &params->dictionary,
                ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
                max_distance, dictionary_start + gap, params->dist.max_distance,
                backward_references, back_refs_position, back_refs_size, &sr2);
            if (sr2.score >= sr.score + cost_diff_lazy || sr2.used_stored) {
              /* Ok, let's just write one byte for now and start a match from the
                 next byte. */
              ++position;
              ++insert_length;
              sr = sr2;
              /* If a reference from backward_references array was found
                 then just take it */
              if (sr2.used_stored) {
                ++delayed_backward_references_in_row;
                break;
              }
              if (++delayed_backward_references_in_row < 4 &&
                  position + FN(HashTypeLength)() < pos_end) {
                continue;
              }
            }
            break;
          }
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics && back_refs_size == 0) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}